

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlFreeNotation(xmlNotationPtr nota)

{
  if (nota != (xmlNotationPtr)0x0) {
    if (nota->name != (xmlChar *)0x0) {
      (*xmlFree)(nota->name);
    }
    if (nota->PublicID != (xmlChar *)0x0) {
      (*xmlFree)(nota->PublicID);
    }
    if (nota->SystemID != (xmlChar *)0x0) {
      (*xmlFree)(nota->SystemID);
    }
    (*xmlFree)(nota);
    return;
  }
  return;
}

Assistant:

static void
xmlFreeNotation(xmlNotationPtr nota) {
    if (nota == NULL) return;
    if (nota->name != NULL)
	xmlFree((xmlChar *) nota->name);
    if (nota->PublicID != NULL)
	xmlFree((xmlChar *) nota->PublicID);
    if (nota->SystemID != NULL)
	xmlFree((xmlChar *) nota->SystemID);
    xmlFree(nota);
}